

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_voter.hpp
# Opt level: O0

void __thiscall libtorrent::aux::ip_voter::~ip_voter(ip_voter *this)

{
  ip_voter *this_local;
  
  ::std::
  vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
  ::~vector(&this->m_external_addresses);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT ip_voter
	{
		ip_voter();

		// returns true if a different IP is the top vote now
		// i.e. we changed our idea of what our external IP is
		bool cast_vote(address const& ip, aux::ip_source_t source_type, address const& source);

		address external_address() const { return m_external_address; }

	private:

		bool maybe_rotate();

		struct external_ip_t
		{
			bool add_vote(sha1_hash const& k, aux::ip_source_t type);

			// we want to sort descending
			bool operator<(external_ip_t const& rhs) const
			{
				if (num_votes > rhs.num_votes) return true;
				if (num_votes < rhs.num_votes) return false;
				return static_cast<std::uint8_t>(sources) > static_cast<std::uint8_t>(rhs.sources);
			}

			// this is a bloom filter of the IPs that have
			// reported this address
			aux::bloom_filter<16> voters;
			// this is the actual external address
			address addr;
			// a bitmask of sources the reporters have come from
			aux::ip_source_t sources{};
			// the total number of votes for this IP
			std::uint16_t num_votes = 0;
		};

		// this is a bloom filter of all the IPs that have
		// been the first to report an external address. Each
		// IP only gets to add a new item once.
		aux::bloom_filter<32> m_external_address_voters;

		std::vector<external_ip_t> m_external_addresses;
		address m_external_address;

		// the total number of unique IPs that have voted
		int m_total_votes;

		// this is true from the first time we rotate. Before
		// we rotate for the first time, we keep updating the
		// external address as we go, since we don't have any
		// stable setting to fall back on. Once this is true,
		// we stop updating it on the fly, and just use the
		// address from when we rotated.
		bool m_valid_external;

		// the last time we rotated this ip_voter. i.e. threw
		// away all the votes and started from scratch, in case
		// our IP has changed
		time_point m_last_rotate;
	}